

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatSkill.cpp
# Opt level: O1

void Handlers::StatSkill_Take(Character *character,PacketReader *reader)

{
  short spell;
  pointer puVar1;
  NPC_Learn_Skill *pNVar2;
  bool bVar3;
  bool bVar4;
  unsigned_short spell_00;
  int iVar5;
  NPC_Data *pNVar6;
  long lVar7;
  uint num;
  uint uVar8;
  pointer puVar9;
  PacketBuilder reply;
  PacketBuilder local_60;
  
  PacketReader::GetInt(reader);
  spell_00 = PacketReader::GetShort(reader);
  num = (uint)(short)spell_00;
  bVar3 = Character::HasSpell(character,spell_00);
  if ((!bVar3) && (character->npc_type == Skills)) {
    pNVar6 = NPC::Data(character->npc);
    puVar1 = (pNVar6->skill_learn).
             super__Vector_base<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar9 = (pNVar6->skill_learn).
                  super__Vector_base<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar1; puVar9 = puVar9 + 1)
    {
      pNVar2 = (puVar9->_M_t).
               super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>._M_t.
               super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>.
               super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl;
      uVar8 = (uint)pNVar2->id;
      if (uVar8 == num) {
        if (character->level < pNVar2->levelreq) {
LAB_00167b88:
          PacketBuilder::PacketBuilder(&local_60,PACKET_STATSKILL,PACKET_REPLY,4);
          PacketBuilder::AddShort(&local_60,2);
          PacketBuilder::AddShort(&local_60,(uint)character->clas);
          Character::Send(character,&local_60);
        }
        else {
          iVar5 = Character::HasItem(character,1,false);
          pNVar2 = (puVar9->_M_t).
                   super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>.
                   super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl;
          if (((((iVar5 < pNVar2->cost) || (*character->display_str < (int)pNVar2->strreq)) ||
               (*character->display_intl < (int)pNVar2->intreq)) ||
              ((*character->display_wis < (int)pNVar2->wisreq ||
               (*character->display_agi < (int)pNVar2->agireq)))) ||
             ((*character->display_con < (int)pNVar2->conreq ||
              (*character->display_cha < (int)pNVar2->chareq)))) goto LAB_00167b88;
          if ((pNVar2->classreq == '\0') || (character->clas == pNVar2->classreq)) {
            lVar7 = 0;
            bVar3 = false;
            do {
              spell = *(short *)((long)(pNVar2->skillreq)._M_elems + lVar7);
              if ((spell != 0) && (bVar4 = Character::HasSpell(character,spell), !bVar4)) {
                PacketBuilder::PacketBuilder(&local_60,PACKET_STATSKILL,PACKET_REPLY,4);
                PacketBuilder::AddShort(&local_60,2);
                PacketBuilder::AddShort(&local_60,(uint)character->clas);
                Character::Send(character,&local_60);
                PacketBuilder::~PacketBuilder(&local_60);
                if (!bVar3) goto LAB_00167bd3;
                break;
              }
              lVar7 = lVar7 + 2;
              bVar3 = lVar7 == 8;
            } while (!bVar3);
            Character::DelItem(character,1,
                               ((puVar9->_M_t).
                                super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>
                                .super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl)->cost
                              );
            Character::AddSpell(character,spell_00);
            PacketBuilder::PacketBuilder(&local_60,PACKET_STATSKILL,PACKET_TAKE,6);
            PacketBuilder::AddShort(&local_60,num);
            iVar5 = Character::HasItem(character,1,false);
            PacketBuilder::AddInt(&local_60,iVar5);
            Character::Send(character,&local_60);
          }
          else {
            PacketBuilder::PacketBuilder(&local_60,PACKET_STATSKILL,PACKET_REPLY,4);
            PacketBuilder::AddShort(&local_60,2);
            PacketBuilder::AddShort(&local_60,(uint)character->clas);
            Character::Send(character,&local_60);
          }
        }
        PacketBuilder::~PacketBuilder(&local_60);
LAB_00167bd3:
        if (uVar8 == num) {
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void StatSkill_Take(Character *character, PacketReader &reader)
{
	/*int shopid = */reader.GetInt();
	short spell_id = reader.GetShort();

	if (character->HasSpell(spell_id))
		return;

	if (character->npc_type == ENF::Skills)
	{
		UTIL_FOREACH_CREF(character->npc->Data().skill_learn, spell)
		{
			if (spell->id == spell_id)
			{
				if (character->level < spell->levelreq || character->HasItem(1) < spell->cost
				 || character->display_str < spell->strreq || character->display_intl < spell->intreq
				 || character->display_wis < spell->wisreq || character->display_agi < spell->agireq
				 || character->display_con < spell->conreq || character->display_cha < spell->chareq)
				{
					// No correct reply for these
					PacketBuilder reply(PACKET_STATSKILL, PACKET_REPLY, 4);
					reply.AddShort(SKILLMASTER_WRONG_CLASS);
					reply.AddShort(character->clas);
					character->Send(reply);
					return;
				}

				if (spell->classreq != 0 && character->clas != spell->classreq)
				{
					PacketBuilder reply(PACKET_STATSKILL, PACKET_REPLY, 4);
					reply.AddShort(SKILLMASTER_WRONG_CLASS);
					reply.AddShort(character->clas);
					character->Send(reply);
					return;
				}

				UTIL_FOREACH(spell->skillreq, req)
				{
					if (req != 0 && !character->HasSpell(req))
					{
						// No correct reply for this
						PacketBuilder reply(PACKET_STATSKILL, PACKET_REPLY, 4);
						reply.AddShort(SKILLMASTER_WRONG_CLASS);
						reply.AddShort(character->clas);
						character->Send(reply);
						return;
					}
				}

				character->DelItem(1, spell->cost);
				character->AddSpell(spell_id);

				PacketBuilder reply(PACKET_STATSKILL, PACKET_TAKE, 6);
				reply.AddShort(spell_id);
				reply.AddInt(character->HasItem(1));
				character->Send(reply);

				break;
			}
		}
	}
}